

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_paged_audio_buffer_read_pcm_frames
                    (ma_paged_audio_buffer *pPagedAudioBuffer,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  void *offsetInFrames;
  void *pvVar1;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RDI;
  ma_paged_audio_buffer_page *pNext;
  ma_uint64 framesToReadThisIteration;
  ma_uint64 framesRemainingToRead;
  ma_uint64 framesRemainingInCurrentPage;
  ma_uint32 channels;
  ma_format format;
  ma_uint64 totalFramesRead;
  ma_result result;
  void *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff88;
  ulong local_50;
  ma_result local_44;
  ma_result local_1c;
  
  local_44 = MA_SUCCESS;
  local_50 = 0;
  if (in_RDI == 0) {
    local_1c = MA_INVALID_ARGS;
  }
  else {
    while (local_50 < in_RDX) {
      offsetInFrames = (void *)(in_RDX - local_50);
      pvVar1 = (void *)(*(long *)(*(long *)(in_RDI + 0x50) + 8) - *(long *)(in_RDI + 0x58));
      if (pvVar1 < offsetInFrames) {
        offsetInFrames = pvVar1;
      }
      pvVar1 = offsetInFrames;
      in_stack_ffffffffffffff78 =
           ma_offset_pcm_frames_ptr
                     (in_stack_ffffffffffffff88,(ma_uint64)offsetInFrames,
                      (ma_format)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                      (ma_uint32)in_stack_ffffffffffffff78);
      ma_offset_pcm_frames_ptr
                (in_stack_ffffffffffffff88,(ma_uint64)offsetInFrames,
                 (ma_format)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (ma_uint32)in_stack_ffffffffffffff78);
      ma_copy_pcm_frames(pvVar1,in_stack_ffffffffffffff88,(ma_uint64)offsetInFrames,
                         (ma_format)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                         (ma_uint32)in_stack_ffffffffffffff78);
      local_50 = (long)pvVar1 + local_50;
      *(long *)(in_RDI + 0x60) = (long)pvVar1 + *(long *)(in_RDI + 0x60);
      *(long *)(in_RDI + 0x58) = (long)pvVar1 + *(long *)(in_RDI + 0x58);
      if (*(long *)(in_RDI + 0x58) == *(long *)(*(long *)(in_RDI + 0x50) + 8)) {
        in_stack_ffffffffffffff88 = (void *)**(long **)(in_RDI + 0x50);
        if (in_stack_ffffffffffffff88 == (void *)0x0) {
          local_44 = MA_AT_END;
          break;
        }
        *(void **)(in_RDI + 0x50) = in_stack_ffffffffffffff88;
        *(undefined8 *)(in_RDI + 0x58) = 0;
      }
    }
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = local_50;
    }
    local_1c = local_44;
  }
  return local_1c;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_read_pcm_frames(ma_paged_audio_buffer* pPagedAudioBuffer, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint64 totalFramesRead = 0;
    ma_format format;
    ma_uint32 channels;

    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    format   = pPagedAudioBuffer->pData->format;
    channels = pPagedAudioBuffer->pData->channels;

    while (totalFramesRead < frameCount) {
        /* Read from the current page. The buffer should never be in a state where this is NULL. */
        ma_uint64 framesRemainingInCurrentPage;
        ma_uint64 framesRemainingToRead = frameCount - totalFramesRead;
        ma_uint64 framesToReadThisIteration;

        MA_ASSERT(pPagedAudioBuffer->pCurrent != NULL);

        framesRemainingInCurrentPage = pPagedAudioBuffer->pCurrent->sizeInFrames - pPagedAudioBuffer->relativeCursor;

        framesToReadThisIteration = ma_min(framesRemainingInCurrentPage, framesRemainingToRead);
        ma_copy_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, format, channels), ma_offset_pcm_frames_ptr(pPagedAudioBuffer->pCurrent->pAudioData, pPagedAudioBuffer->relativeCursor, format, channels), framesToReadThisIteration, format, channels);
        totalFramesRead += framesToReadThisIteration;

        pPagedAudioBuffer->absoluteCursor += framesToReadThisIteration;
        pPagedAudioBuffer->relativeCursor += framesToReadThisIteration;

        /* Move to the next page if necessary. If there's no more pages, we need to return MA_AT_END. */
        MA_ASSERT(pPagedAudioBuffer->relativeCursor <= pPagedAudioBuffer->pCurrent->sizeInFrames);

        if (pPagedAudioBuffer->relativeCursor == pPagedAudioBuffer->pCurrent->sizeInFrames) {
            /* We reached the end of the page. Need to move to the next. If there's no more pages, we're done. */
            ma_paged_audio_buffer_page* pNext = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPagedAudioBuffer->pCurrent->pNext);
            if (pNext == NULL) {
                result = MA_AT_END;
                break;  /* We've reached the end. */
            } else {
                pPagedAudioBuffer->pCurrent       = pNext;
                pPagedAudioBuffer->relativeCursor = 0;
            }
        }
    }

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesRead;
    }

    return result;
}